

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O3

size_type __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeValue>::size
          (File<hta::storage::file::Metric::Header,_hta::TimeValue> *this)

{
  long lVar1;
  ulong uVar2;
  
  std::istream::seekg((long)&this->stream_,_S_beg);
  check_stream(this,"seekg to end for size");
  lVar1 = std::istream::tellg();
  uVar2 = lVar1 - (this->data_begin_)._M_off;
  if (-1 < (long)uVar2) {
    return uVar2 >> 4;
  }
  __assert_fail("size_bytes >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/file.hpp"
                ,0xd1,
                "size_type hta::storage::file::File<hta::storage::file::Metric::Header, hta::TimeValue>::size() [HeaderType = hta::storage::file::Metric::Header, T = hta::TimeValue]"
               );
}

Assistant:

size_type size()
    {
        stream_.seekg(0, std::fstream::end);
        check_stream("seekg to end for size");
        auto size_bytes = ssize_t(stream_.tellg()) - ssize_t(data_begin_);
        assert(size_bytes >= 0);
        // A file that is written in the background may have incomple records
        // during flush. It is useful to allow reading such a file.
        // assert(0 == size_bytes % value_size);
        return size_bytes / value_size;
    }